

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::GetTimeStepForJAOHI(PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  ulong uVar1;
  Index IVar2;
  JointActionObservationHistoryTree *pJVar3;
  E *this_00;
  ulong uVar4;
  
  if ((this->_m_params)._m_jointActionObservationHistories == true) {
    pJVar3 = GetJointActionObservationHistoryTree(this,jaohI);
    IVar2 = (Index)(((pJVar3->super_TreeNode<JointActionObservationHistory>)._m_containedElem)->
                   super_JointHistory).super_History._m_length;
  }
  else {
    uVar1 = (this->super_PlanningUnit)._m_horizon;
    if (uVar1 == 999999) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,
           "PlanningUnitMADPDiscrete::GetTimeStepForJAOHI does not work yet for infinite-horizon case"
          );
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    uVar4 = 0xffffffffffffffff;
    do {
      IVar2 = (Index)uVar4;
      uVar4 = (ulong)(IVar2 + 1);
      if (uVar1 <= uVar4) {
        return IVar2;
      }
    } while ((this->_m_firstJAOHIforT).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4] <= jaohI);
  }
  return IVar2;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetTimeStepForJAOHI(LIndex jaohI) const
{
    // copied from GetTimeStepForJOHI
    if(_m_params.GetComputeJointActionObservationHistories())
        return(GetJointActionObservationHistoryTree(jaohI)->
               GetContainedElement()->GetLength() ); 
    else
    {
        Index t = 0;
        if(GetHorizon()==MAXHORIZON)
            throw(E("PlanningUnitMADPDiscrete::GetTimeStepForJAOHI does not work yet for infinite-horizon case"));

        while( t < GetHorizon() && _m_firstJAOHIforT[t] <= jaohI )
            t++;
        //  _m_firstJAOHIforT[t] > johI  OR t==GetHorizon
        if(t == GetHorizon())
            t--; //last time step is h-1
        else
            t--;//_m_nrJointActionObservationHistoriesT[t] > jaohI so
                //johI belongs to previous time step.
        return(t);
    }
}